

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool square_player_trap_allowed(chunk_conflict2 *c,loc_conflict grid)

{
  _Bool _Var1;
  object *poVar2;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  _Var1 = square_istrap((chunk *)c,grid);
  if (_Var1) {
    grid_local.x._3_1_ = false;
  }
  else {
    poVar2 = square_object((chunk *)c,grid);
    if (poVar2 == (object *)0x0) {
      grid_local.x._3_1_ = square_istrappable((chunk *)c,grid);
    }
    else {
      grid_local.x._3_1_ = false;
    }
  }
  return grid_local.x._3_1_;
}

Assistant:

bool square_player_trap_allowed(struct chunk *c, struct loc grid)
{

    /* We currently forbid multiple traps in a grid under normal conditions.
     * If this changes, various bits of code elsewhere will have to change too.
     */
    if (square_istrap(c, grid))
		return false;

    /* We currently forbid traps in a grid with objects. */
    if (square_object(c, grid))
		return false;

    /* Check it's a trappable square */
    return (square_istrappable(c, grid));
}